

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallmon.cpp
# Opt level: O3

pair<int,_unsigned_long_long> __thiscall
wallmon::get_mother_starttime(wallmon *this,pid_t mother_pid)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  undefined8 uVar4;
  uint uVar5;
  char *pcVar6;
  bool bVar7;
  pair<int,_unsigned_long_long> pVar8;
  string tmp_str;
  stringstream strm;
  ifstream proc_stat;
  stringstream stat_fname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5a8;
  string local_588;
  value_type local_568;
  ostream *local_548 [2];
  ostream local_538 [112];
  ios_base local_4c8 [264];
  long local_3c0 [4];
  byte abStack_3a0 [488];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_5a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_5a8,0x34);
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  local_568._M_string_length = 0;
  local_568.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"/proc/",6);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,mother_pid);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/stat",5);
  std::ostream::put((char)poVar2);
  std::__cxx11::stringbuf::str();
  std::ifstream::ifstream(local_3c0,(string *)local_548,_S_in);
  if (local_548[0] != local_538) {
    operator_delete(local_548[0]);
  }
  if ((abStack_3a0[*(long *)(local_3c0[0] + -0x18)] & 5) == 0) {
    do {
      if ((0x2bf < (ulong)((long)local_5a8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_5a8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) ||
         (std::operator>>((istream *)local_3c0,(string *)&local_568),
         (abStack_3a0[*(long *)(local_3c0[0] + -0x18)] & 5) != 0)) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_5a8,&local_568);
    } while ((abStack_3a0[*(long *)(local_3c0[0] + -0x18)] & 5) == 0);
  }
  if ((ulong)((long)local_5a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_5a8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x2a1) {
LAB_0018c504:
    std::__cxx11::stringstream::stringstream((stringstream *)local_548);
    std::__ostream_insert<char,std::char_traits<char>>(local_538,"Read only ",10);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_538);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," from mother PID stat file",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(local_538,"Stream status of ",0x11);
    std::__cxx11::stringbuf::str();
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_538,local_588._M_dataplus._M_p,local_588._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," is ",4);
    bVar7 = (abStack_3a0[*(long *)(local_3c0[0] + -0x18)] & 5) == 0;
    pcVar6 = "bad";
    if (bVar7) {
      pcVar6 = "good";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,(ulong)bVar7 + 3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != &local_588.field_2) {
      operator_delete(local_588._M_dataplus._M_p);
    }
    std::__cxx11::stringbuf::str();
    MessageBase::warning(&this->super_MessageBase,&local_588);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != &local_588.field_2) {
      operator_delete(local_588._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_548);
    std::ios_base::~ios_base(local_4c8);
    uVar5 = 1;
    this = (wallmon *)0x0;
  }
  else {
    poVar2 = (ostream *)
             local_5a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[0x15]._M_dataplus._M_p;
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    *piVar3 = 0;
    this = (wallmon *)strtol((char *)poVar2,(char **)local_548,10);
    if (local_548[0] == poVar2) {
      uVar4 = std::__throw_invalid_argument("stol");
      if ((int *)local_588._M_dataplus._M_p != piVar3) {
        operator_delete(local_588._M_dataplus._M_p);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_548);
      std::ios_base::~ios_base(local_4c8);
      std::ifstream::~ifstream(local_3c0);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_568._M_dataplus._M_p != &local_568.field_2) {
        operator_delete(local_568._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_5a8);
      _Unwind_Resume(uVar4);
    }
    if (*piVar3 == 0) {
      *piVar3 = iVar1;
    }
    else if (*piVar3 == 0x22) {
      std::__throw_out_of_range("stol");
      goto LAB_0018c504;
    }
    uVar5 = 0;
  }
  std::ifstream::~ifstream(local_3c0);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5a8);
  pVar8._4_4_ = 0;
  pVar8.first = uVar5;
  pVar8.second = (unsigned_long_long)this;
  return pVar8;
}

Assistant:

std::pair<int, unsigned long long> wallmon::get_mother_starttime(
    pid_t mother_pid) {
  std::vector<std::string> stat_entries{};
  stat_entries.reserve(52);
  std::string tmp_str{};
  unsigned long long start_time_clock_t;

  std::stringstream stat_fname{};
  stat_fname << "/proc/" << mother_pid << "/stat" << std::ends;
  std::ifstream proc_stat{stat_fname.str()};
  while (proc_stat && stat_entries.size() < prmon::uptime_pos + 1) {
    proc_stat >> tmp_str;
    if (proc_stat) stat_entries.push_back(tmp_str);
  }
  if (stat_entries.size() > prmon::uptime_pos) {
    start_time_clock_t = std::stol(stat_entries[prmon::uptime_pos]);
  } else {
    // Some error happened!
    std::stringstream strm;
    strm << "Read only " << stat_entries.size() << " from mother PID stat file"
         << std::endl;
    strm << "Stream status of " << stat_fname.str() << " is "
         << (proc_stat ? "good" : "bad") << std::endl;
    warning(strm.str());
    return std::pair<int, unsigned long long>{1, 0L};
  }
  return std::pair<int, unsigned long long>{0, start_time_clock_t};
}